

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiAreaTabBar::mousePressEvent(QMdiAreaTabBar *this,QMouseEvent *event)

{
  bool bVar1;
  int index;
  QWidget *this_00;
  long in_FS_OFFSET;
  double dVar2;
  undefined1 auVar3 [16];
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(event + 0x40) == 4) {
    auVar3 = QEventPoint::position();
    dVar2 = (double)((ulong)auVar3._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar3._0_8_;
    bVar1 = 2147483647.0 < dVar2;
    if (dVar2 <= -2147483648.0) {
      dVar2 = -2147483648.0;
    }
    local_20.xp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
    dVar2 = (double)((ulong)auVar3._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar3._8_8_;
    bVar1 = 2147483647.0 < dVar2;
    if (dVar2 <= -2147483648.0) {
      dVar2 = -2147483648.0;
    }
    local_20.yp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
    index = QTabBar::tabAt(&this->super_QTabBar,&local_20);
    this_00 = &subWindowFromIndex(this,index)->super_QWidget;
    if (this_00 == (QWidget *)0x0) {
      event[0xc] = (QMouseEvent)0x0;
    }
    else {
      QWidget::close(this_00,index);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QTabBar::mousePressEvent(&this->super_QTabBar,event);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaTabBar::mousePressEvent(QMouseEvent *event)
{
    if (event->button() != Qt::MiddleButton) {
        QTabBar::mousePressEvent(event);
        return;
    }

    QMdiSubWindow *subWindow = subWindowFromIndex(tabAt(event->position().toPoint()));
    if (!subWindow) {
        event->ignore();
        return;
    }

    subWindow->close();
}